

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O2

void __thiscall Texture::loadTexture(Texture *this,string *imagePath)

{
  GLuint GVar1;
  ResourceManager *pRVar2;
  uchar *img_data;
  ostream *poVar3;
  string local_80;
  string local_60;
  int local_40;
  int local_3c;
  int width;
  int height;
  GLuint texture_id;
  bool succes;
  
  height._3_1_ = '\0';
  pRVar2 = ResourceManager::getInstance();
  std::__cxx11::string::string((string *)&local_80,(string *)imagePath);
  GVar1 = ResourceManager::getTexture(pRVar2,&local_80,(bool *)((long)&height + 3));
  this->textureBuffer = GVar1;
  std::__cxx11::string::~string((string *)&local_80);
  if (height._3_1_ == '\0') {
    glEnable(0xde1);
    glGenTextures(1,&width);
    glBindTexture(0xde1,width);
    img_data = SOIL_load_image((imagePath->_M_dataplus)._M_p,&local_40,&local_3c,(int *)0x0,4);
    glTexImage2D(0xde1,0,0x1908,local_40,local_3c,0,0x1908,0x1401,img_data);
    glTexParameteri(0xde1,0x2802,0x2901);
    glTexParameteri(0xde1,0x2803,0x2901);
    glTexParameteri(0xde1,0x2800,0x2601);
    glTexParameteri(0xde1,0x2801,0x2703);
    (*__glewGenerateMipmap)(0xde1);
    poVar3 = std::operator<<((ostream *)&std::cout,"Width: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_40);
    poVar3 = std::operator<<(poVar3,", Height: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_3c);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"Image ID: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    SOIL_free_image_data(img_data);
    if (width == -1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Failed loading: ");
      poVar3 = std::operator<<(poVar3,(string *)imagePath);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    this->textureBuffer = width;
    pRVar2 = ResourceManager::getInstance();
    std::__cxx11::string::string((string *)&local_60,(string *)imagePath);
    ResourceManager::addTexture(pRVar2,width,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

void Texture::loadTexture(std::string imagePath)
{
	bool succes = false;
	this->textureBuffer = ResourceManager::getInstance()->getTexture(imagePath, succes);
	if (succes)
	{
		return;
	}
	glEnable(GL_TEXTURE_2D);

	GLuint texture_id;
	glGenTextures(1, &texture_id);
	glBindTexture(GL_TEXTURE_2D, texture_id);
	int width;
	int height;
	unsigned char* image = SOIL_load_image(imagePath.c_str(), &width, &height, 0, SOIL_LOAD_RGBA);
	glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, width, height, 0, GL_RGBA, GL_UNSIGNED_BYTE, image);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_LINEAR);
	glGenerateMipmap(GL_TEXTURE_2D);


	std::cout << "Width: " << width << ", Height: " << height << std::endl;
	std::cout << "Image ID: " << texture_id << std::endl;

	SOIL_free_image_data(image);

	if (texture_id == -1)
	{
		std::cout << "Failed loading: " << imagePath << std::endl;
	}
	
	textureBuffer = texture_id;
	ResourceManager::getInstance()->addTexture(texture_id, imagePath);
}